

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MediaManager.cpp
# Opt level: O2

void __thiscall MediaManager::Init(MediaManager *this)

{
  int iVar1;
  Disk *this_00;
  vector<IMedia_*,_std::allocator<IMedia_*>_> *this_01;
  pointer ppIVar2;
  Disk *local_50;
  vector<IContainedElement_*,_std::allocator<IContainedElement_*>_> list_of_elements;
  
  ClearList(this);
  DataContainer::GetFileList(&list_of_elements,this->container_);
  this_01 = &this->media_list_;
  for (ppIVar2 = list_of_elements.
                 super__Vector_base<IContainedElement_*,_std::allocator<IContainedElement_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppIVar2 !=
      list_of_elements.super__Vector_base<IContainedElement_*,_std::allocator<IContainedElement_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppIVar2 = ppIVar2 + 1) {
    iVar1 = (*(*ppIVar2)->_vptr_IContainedElement[2])();
    switch(iVar1) {
    case 1:
      local_50 = (Disk *)operator_new(0x10);
      (local_50->super_IMedia).type_ = 1;
      (local_50->super_IMedia)._vptr_IMedia = (_func_int **)&PTR_GetType_0018eac8;
      std::vector<IMedia*,std::allocator<IMedia*>>::emplace_back<IMedia*>
                ((vector<IMedia*,std::allocator<IMedia*>> *)this_01,(IMedia **)&local_50);
      break;
    case 3:
      this_00 = (Disk *)operator_new(0x38);
      Disk::Disk(this_00,3,*ppIVar2);
      local_50 = this_00;
      std::vector<IMedia*,std::allocator<IMedia*>>::emplace_back<IMedia*>
                ((vector<IMedia*,std::allocator<IMedia*>> *)this_01,(IMedia **)&local_50);
      break;
    case 4:
      local_50 = (Disk *)operator_new(0x10);
      (local_50->super_IMedia).type_ = 4;
      (local_50->super_IMedia)._vptr_IMedia = (_func_int **)&PTR_GetType_0018ea68;
      std::vector<IMedia*,std::allocator<IMedia*>>::emplace_back<IMedia*>
                ((vector<IMedia*,std::allocator<IMedia*>> *)this_01,(IMedia **)&local_50);
      break;
    case 5:
      local_50 = (Disk *)operator_new(0x10);
      (local_50->super_IMedia).type_ = 5;
      (local_50->super_IMedia)._vptr_IMedia = (_func_int **)&PTR_GetType_0018eaf8;
      std::vector<IMedia*,std::allocator<IMedia*>>::emplace_back<IMedia*>
                ((vector<IMedia*,std::allocator<IMedia*>> *)this_01,(IMedia **)&local_50);
      break;
    case 6:
      local_50 = (Disk *)operator_new(0x10);
      (local_50->super_IMedia).type_ = 6;
      (local_50->super_IMedia)._vptr_IMedia = (_func_int **)&PTR_GetType_0018ea98;
      std::vector<IMedia*,std::allocator<IMedia*>>::emplace_back<IMedia*>
                ((vector<IMedia*,std::allocator<IMedia*>> *)this_01,(IMedia **)&local_50);
      break;
    case 8:
      local_50 = (Disk *)operator_new(0x10);
      (local_50->super_IMedia).type_ = 8;
      (local_50->super_IMedia)._vptr_IMedia = (_func_int **)&PTR_GetType_0018eb28;
      std::vector<IMedia*,std::allocator<IMedia*>>::emplace_back<IMedia*>
                ((vector<IMedia*,std::allocator<IMedia*>> *)this_01,(IMedia **)&local_50);
    }
  }
  std::_Vector_base<IContainedElement_*,_std::allocator<IContainedElement_*>_>::~_Vector_base
            (&list_of_elements.
              super__Vector_base<IContainedElement_*,_std::allocator<IContainedElement_*>_>);
  return;
}

Assistant:

void MediaManager::Init()
{
   ClearList();

   std::vector<IContainedElement*> list_of_elements = container_->GetFileList();

   // Check buffer :
   for (auto& list_of_element : list_of_elements)
   {
      const int type = list_of_element->GetType();

      // Add a media type
      switch (type)
      {
      case MEDIA_DISK:
         media_list_.push_back(new Disk(type, list_of_element));
         break;
      case MEDIA_TAPE:
         media_list_.push_back(new Tape(type));
         break;
      case MEDIA_BIN:
         media_list_.push_back(new Binary(type));
         break;
      case MEDIA_SNA:
         media_list_.push_back(new Snapshot(type));
         break;
      case MEDIA_SNR:
         media_list_.push_back(new SnapshotReplay(type));
         break;
      case MEDIA_CPR:
         media_list_.push_back(new CPR(type));
         break;
      default: // unhandled type
         break;
      }
   }
}